

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> *
immutable::rrb_details::append_empty<immutable::vector<char,false,6>,true>
          (ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_>
           *to_set,uint32_t empty_height)

{
  internal_node<immutable::vector<char,_false,_6>,_true> *p_node;
  int iVar1;
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> new_empty;
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> empty;
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> local_48;
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> local_40;
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> *local_38;
  
  if (empty_height != 0) {
    local_38 = to_set;
    p_node = (internal_node<immutable::vector<char,_false,_6>,_true> *)malloc(0x28);
    p_node->type = INTERNAL_NODE;
    p_node->len = 1;
    (p_node->size_table).ptr = (rrb_size_table<true> *)0x0;
    p_node->guid = 0;
    p_node->child =
         (ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> *)
         (p_node + 1);
    p_node[1].type = LEAF_NODE;
    p_node[1].len = 0;
    LOCK();
    (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    LOCK();
    (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    local_40.ptr = p_node;
    if (empty_height != 1) {
      iVar1 = empty_height - 1;
      do {
        local_48.ptr = (internal_node<immutable::vector<char,_false,_6>,_true> *)malloc(0x28);
        (local_48.ptr)->type = INTERNAL_NODE;
        (local_48.ptr)->len = 1;
        ((local_48.ptr)->size_table).ptr = (rrb_size_table<true> *)0x0;
        (local_48.ptr)->guid = 0;
        (local_48.ptr)->child =
             (ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> *
             )(local_48.ptr + 1);
        local_48.ptr[1].type = LEAF_NODE;
        local_48.ptr[1].len = 0;
        LOCK();
        ((local_48.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
        if (local_48.ptr == (internal_node<immutable::vector<char,_false,_6>,_true> *)0x0) {
          __assert_fail("ptr != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                        ,0x71a,
                        "T *immutable::ref<immutable::rrb_details::internal_node<immutable::vector<char, false, 6>, true>>::operator->() const [T = immutable::rrb_details::internal_node<immutable::vector<char, false, 6>, true>]"
                       );
        }
        ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_>::
        operator=((local_48.ptr)->child,&local_40);
        ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_>::
        operator=(&local_40,&local_48);
        release<immutable::vector<char,false,6>>(local_48.ptr);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_>::operator=
              (local_38,&local_40);
    to_set = p_node->child;
    release<immutable::vector<char,false,6>>(local_40.ptr);
    release<immutable::vector<char,false,6>>(p_node);
  }
  return to_set;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>>* append_empty(ref<internal_node<T, atomic_ref_counting>>* to_set, uint32_t empty_height)
      {
      if (0 < empty_height)
        {
        ref<internal_node<T, atomic_ref_counting>> leaf = internal_node_create<T, atomic_ref_counting>(1);
        ref<internal_node<T, atomic_ref_counting>> empty = leaf;
        for (uint32_t i = 1; i < empty_height; i++)
          {
          ref<internal_node<T, atomic_ref_counting>> new_empty = internal_node_create<T, atomic_ref_counting>(1);
          new_empty->child[0] = empty;
          empty = new_empty;
          }
        // this root node must be one larger, otherwise segfault        
        *to_set = empty;
        return &leaf->child[0];
        }
      else
        {
        return to_set;
        }
      }